

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Gia_ManTestDistance(Gia_Man_t *pGia)

{
  abctime aVar1;
  Emb_Man_t *p_00;
  abctime aVar2;
  abctime clk;
  Emb_Man_t *p;
  Gia_Man_t *pGia_local;
  
  aVar1 = Abc_Clock();
  p_00 = Emb_ManStart(pGia);
  Emb_ManPrintStats(p_00);
  Abc_Print(1,"%s =","Time");
  aVar2 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
  Gia_ManTestDistanceInternal(p_00);
  Emb_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManTestDistance( Gia_Man_t * pGia )
{
    Emb_Man_t * p;
    abctime clk = Abc_Clock();
    p = Emb_ManStart( pGia );
//    Emb_ManPrintFanio( p );
    Emb_ManPrintStats( p );
ABC_PRT( "Time", Abc_Clock() - clk );
    Gia_ManTestDistanceInternal( p );
    Emb_ManStop( p );
}